

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O3

void __thiscall Task::Task(Task *this,int _max_task_size)

{
  this->max_task_num = _max_task_size;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->product_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>
                     *)&this->product_task,0);
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->consum_task).c.
  super__Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<channel>,_std::allocator<std::shared_ptr<channel>_>_>
                     *)&this->consum_task,0);
  pthread_mutex_init((pthread_mutex_t *)&this->Product_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->Comsumer_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->Swap_Cond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->ComsumCond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->ProductCond,(pthread_condattr_t *)0x0);
  pthread_create(&this->swap_thread,(pthread_attr_t *)0x0,swap_task,this);
  return;
}

Assistant:

Task::Task(int _max_task_size):
max_task_num(_max_task_size)
{
    pthread_mutex_init(&Product_Mutex,NULL);
    pthread_mutex_init(&Comsumer_Mutex,NULL);
    pthread_cond_init(&Swap_Cond,NULL);
    pthread_cond_init(&ComsumCond,NULL);
    pthread_cond_init(&ProductCond,NULL);
    pthread_create(&swap_thread,NULL,Task::swap_task,(void*)(this));
}